

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O2

void Min_CubeWrite(FILE *pFile,Min_Cube_t *pCube)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int __c;
  uint uVar4;
  bool bVar5;
  
  uVar4 = *(uint *)&pCube->field_0x8;
  uVar1 = Min_CubeCountLits(pCube);
  if (uVar4 >> 0x16 == uVar1) {
    bVar3 = 0;
    for (uVar1 = 0; uVar1 < (uVar4 & 0x3ff); uVar1 = uVar1 + 1) {
      bVar5 = (pCube->uData[uVar1 >> 4] >> (bVar3 & 0x1e) & 2) == 0;
      iVar2 = 0x31;
      if (bVar5) {
        iVar2 = 0x3f;
      }
      __c = (uint)bVar5 * 3 + 0x2d;
      if ((pCube->uData[uVar1 >> 4] >> (bVar3 & 0x1e) & 1) == 0) {
        __c = iVar2;
      }
      fputc(__c,(FILE *)pFile);
      uVar4 = *(uint *)&pCube->field_0x8;
      bVar3 = bVar3 + 2;
    }
    fwrite(" 1\n",3,1,(FILE *)pFile);
    return;
  }
  __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinUtil.c"
                ,0x6d,"void Min_CubeWrite(FILE *, Min_Cube_t *)");
}

Assistant:

void Min_CubeWrite( FILE * pFile, Min_Cube_t * pCube )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "-" );
            else
                fprintf( pFile, "0" );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "1" );
            else
                fprintf( pFile, "?" );
        }
    fprintf( pFile, " 1\n" );
//    fprintf( pFile, " %d\n", pCube->nLits );
}